

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O3

char * TEST_add_static_int_array_option(void)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  cargo_t cargo;
  size_t count;
  int a [3];
  char *args [5];
  
  iVar1 = cargo_init(&cargo,0,"program");
  if (iVar1 == 0) {
    args[4] = "3";
    args[2] = "1";
    args[3] = "-2";
    args[0]._0_4_ = 0x12aaaa;
    args[0]._4_4_ = 0;
    args[1]._0_4_ = 0x12aa53;
    args[1]._4_4_ = 0;
    count = 0;
    iVar1 = cargo_add_option(cargo,0,"--beta -b","Description",".[i]#",a,&count,3);
    if (iVar1 == 0) {
      iVar1 = cargo_parse(cargo,0,1,5,args);
      if (iVar1 == 0) {
        if (count == 3) {
          printf("Read %lu values from int array:\n",3);
          lVar3 = 0;
          do {
            printf("  %d\n",(ulong)(uint)a[lVar3]);
            lVar3 = lVar3 + 1;
          } while (lVar3 != 3);
          puts("Check that \"a\" has ARRAY_SIZE elements");
          if (count == 3) {
            pcVar2 = (char *)0x0;
            lVar3 = 0;
            do {
              if (*(int *)((long)a + lVar3) != *(int *)((long)&DAT_00123138 + lVar3)) {
                pcVar2 = "Array contains unexpected value";
                break;
              }
              lVar3 = lVar3 + 4;
            } while (lVar3 != 0xc);
          }
          else {
            pcVar2 = "a array count count is not expected ARRAY_SIZE";
          }
        }
        else {
          pcVar2 = "Array count is invalid";
        }
      }
      else {
        pcVar2 = "Failed to parse array: a[ARRAY_SIZE]";
      }
    }
    else {
      pcVar2 = "Failed to add a[ARRAY_SIZE] array option";
    }
    cargo_destroy(&cargo);
  }
  else {
    pcVar2 = "Failed to init cargo";
  }
  return pcVar2;
}

Assistant:

_TEST_START(TEST_add_static_int_array_option)
{
    int a[3];
    int a_expect[3] = { 1, -2, 3 };
    char *args[] = { "program", "--beta", "1", "-2", "3" };
    _ADD_TEST_FIXED_ARRAY(".[i]#", "%d");
    _TEST_CLEANUP();
}